

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.c
# Opt level: O2

void conv_directx(double *inp1,int N,double *inp2,int L,double *oup)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  
  uVar1 = (N + L) - 1;
  uVar4 = 0;
  uVar3 = (ulong)(uint)N;
  if (N < 1) {
    uVar3 = uVar4;
  }
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar4;
  }
  for (; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    oup[uVar4] = 0.0;
    dVar7 = 0.0;
    uVar5 = uVar4;
    for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
      if ((long)uVar5 < (long)L && -1 < (long)uVar5) {
        dVar7 = dVar7 + inp1[uVar6] * inp2[uVar5];
        oup[uVar4] = dVar7;
      }
      uVar5 = uVar5 - 1;
    }
  }
  return;
}

Assistant:

void conv_directx(fft_type *inp1,int N, fft_type *inp2, int L,fft_type *oup){
	int M,k,n;
	
	M = N + L - 1;
	
	for (k = 0; k < M;++k) {
		oup[k] = 0.0;
		for ( n = 0; n < N; ++n) {
			if ( (k-n) >= 0 && (k-n) < L ) {
				oup[k]+= inp1[n] * inp2[k-n];
			}
		}
		
	}
		
}